

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

lbool __thiscall Minisat::Solver::solve_(Solver *this)

{
  bool bVar1;
  lbool lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int i;
  long lVar7;
  lbool *this_00;
  double dVar8;
  lbool status;
  
  if ((this->model).data != (lbool *)0x0) {
    (this->model).sz = 0;
  }
  IntSet<Minisat::Lit,_Minisat::MkIndexLit>::clear
            (&(this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>,false);
  if (this->ok == true) {
    this->solves = this->solves + 1;
    dVar8 = (double)(int)this->num_clauses * this->learntsize_factor;
    this->max_learnts = dVar8;
    if (dVar8 < (double)this->min_learnts_lim) {
      this->max_learnts = (double)this->min_learnts_lim;
    }
    this->learntsize_adjust_confl = (double)this->learntsize_adjust_start_confl;
    this->learntsize_adjust_cnt = this->learntsize_adjust_start_confl;
    status.value = l_Undef.value;
    if (0 < this->verbosity) {
      puts("============================[ Search Statistics ]==============================");
      puts("| Conflicts |          ORIGINAL         |          LEARNT          | Progress |");
      puts("|           |    Vars  Clauses Literals |    Limit  Clauses Lit/Cl |          |");
      puts("===============================================================================");
    }
    iVar5 = 0;
    do {
      bVar1 = lbool::operator==(&status,l_Undef);
      if (!bVar1) break;
      iVar4 = iVar5;
      if (this->luby_restart == true) {
        iVar4 = 0;
        for (iVar6 = 1; iVar3 = iVar5, iVar6 <= iVar5; iVar6 = iVar6 * 2 + 1) {
          iVar4 = iVar4 + 1;
        }
        for (; iVar6 + -1 != iVar3; iVar3 = iVar3 % iVar6) {
          iVar6 = iVar6 + -1 >> 1;
          iVar4 = iVar4 + -1;
        }
      }
      dVar8 = pow(this->restart_inc,(double)iVar4);
      status = search(this,(int)((double)this->restart_first * dVar8));
      bVar1 = withinBudget(this);
      iVar5 = iVar5 + 1;
    } while (bVar1);
    if (0 < this->verbosity) {
      puts("===============================================================================");
    }
    this_00 = &status;
    bVar1 = lbool::operator==(this_00,l_True);
    if (bVar1) {
      vec<Minisat::lbool,_int>::growTo(&this->model,this->next_var);
      for (lVar7 = 0; lVar7 < this->next_var; lVar7 = lVar7 + 1) {
        lVar2 = value(this,(Var)lVar7);
        (this->model).data[lVar7].value = lVar2.value;
      }
    }
    else {
      bVar1 = lbool::operator==(&status,l_False);
      if ((bVar1) && ((this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.xs.sz == 0))
      {
        this->ok = false;
      }
    }
    cancelUntil(this,0);
  }
  else {
    this_00 = &l_False;
  }
  return (lbool)this_00->value;
}

Assistant:

lbool Solver::solve_()
{
    model.clear();
    conflict.clear();
    if (!ok) return l_False;

    solves++;

    max_learnts = nClauses() * learntsize_factor;
    if (max_learnts < min_learnts_lim)
        max_learnts = min_learnts_lim;

    learntsize_adjust_confl   = learntsize_adjust_start_confl;
    learntsize_adjust_cnt     = (int)learntsize_adjust_confl;
    lbool   status            = l_Undef;

    if (verbosity >= 1){
        printf("============================[ Search Statistics ]==============================\n");
        printf("| Conflicts |          ORIGINAL         |          LEARNT          | Progress |\n");
        printf("|           |    Vars  Clauses Literals |    Limit  Clauses Lit/Cl |          |\n");
        printf("===============================================================================\n");
    }

    // Search:
    int curr_restarts = 0;
    while (status == l_Undef){
        double rest_base = luby_restart ? luby(restart_inc, curr_restarts) : pow(restart_inc, curr_restarts);
        status = search(rest_base * restart_first);
        if (!withinBudget()) break;
        curr_restarts++;
    }

    if (verbosity >= 1)
        printf("===============================================================================\n");


    if (status == l_True){
        // Extend & copy model:
        model.growTo(nVars());
        for (int i = 0; i < nVars(); i++) model[i] = value(i);
    }else if (status == l_False && conflict.size() == 0)
        ok = false;

    cancelUntil(0);
    return status;
}